

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_stbvorbis_init_memory
                    (void *pData,size_t dataSize,ma_decoding_backend_config *pConfig,
                    ma_allocation_callbacks *pAllocationCallbacks,ma_stbvorbis *pVorbis)

{
  stb_vorbis *psVar1;
  ma_stbvorbis *in_RDX;
  ma_decoding_backend_config *in_RSI;
  ma_stbvorbis *in_RDI;
  long in_R8;
  ma_result result;
  stb_vorbis_alloc *in_stack_00000740;
  int *in_stack_00000748;
  int in_stack_00000754;
  uchar *in_stack_00000758;
  undefined4 local_4;
  
  local_4 = ma_stbvorbis_init_internal(in_RSI,in_RDX);
  if (local_4 == MA_SUCCESS) {
    if (in_RSI < (ma_decoding_backend_config *)0x80000000) {
      psVar1 = stb_vorbis_open_memory
                         (in_stack_00000758,in_stack_00000754,in_stack_00000748,in_stack_00000740);
      *(stb_vorbis **)(in_R8 + 0xa0) = psVar1;
      if (*(long *)(in_R8 + 0xa0) == 0) {
        local_4 = MA_INVALID_FILE;
      }
      else {
        *(undefined4 *)(in_R8 + 0xa8) = 0;
        local_4 = ma_stbvorbis_post_init(in_RDI);
        if (local_4 == MA_SUCCESS) {
          local_4 = MA_SUCCESS;
        }
        else {
          stb_vorbis_close((stb_vorbis *)0x1edff1);
        }
      }
    }
    else {
      local_4 = MA_TOO_BIG;
    }
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_stbvorbis_init_memory(const void* pData, size_t dataSize, const ma_decoding_backend_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_stbvorbis* pVorbis)
{
    ma_result result;

    result = ma_stbvorbis_init_internal(pConfig, pVorbis);
    if (result != MA_SUCCESS) {
        return result;
    }

    #if !defined(MA_NO_VORBIS)
    {
        (void)pAllocationCallbacks;

        /* stb_vorbis uses an int as its size specifier, restricting it to 32-bit even on 64-bit systems. *sigh*. */
        if (dataSize > INT_MAX) {
            return MA_TOO_BIG;
        }

        pVorbis->stb = stb_vorbis_open_memory((const unsigned char*)pData, (int)dataSize, NULL, NULL);
        if (pVorbis->stb == NULL) {
            return MA_INVALID_FILE;
        }

        pVorbis->usingPushMode = MA_FALSE;

        result = ma_stbvorbis_post_init(pVorbis);
        if (result != MA_SUCCESS) {
            stb_vorbis_close(pVorbis->stb);
            return result;
        }

        return MA_SUCCESS;
    }
    #else
    {
        /* vorbis is disabled. */
        (void)pData;
        (void)dataSize;
        (void)pAllocationCallbacks;
        return MA_NOT_IMPLEMENTED;
    }
    #endif
}